

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::yml::detail::ReferenceResolver::count_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  NodeType_e NVar1;
  code *pcVar2;
  NodeType_e NVar3;
  NodeType_e NVar4;
  bool bVar5;
  size_t sVar6;
  ulong uVar7;
  size_t n_00;
  size_t sVar8;
  Tree *pTVar9;
  Tree *pTVar10;
  
  pTVar10 = this->t;
  uVar7 = pTVar10->m_cap;
  pTVar9 = pTVar10;
  if (n == 0xffffffffffffffff || uVar7 <= n) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      sVar6 = (*pcVar2)();
      return sVar6;
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar9 = this->t;
    uVar7 = pTVar9->m_cap;
  }
  NVar3 = pTVar10->m_buf[n].m_type.type;
  if ((n == 0xffffffffffffffff) || (pTVar10 = pTVar9, uVar7 <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      sVar6 = (*pcVar2)();
      return sVar6;
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar10 = this->t;
    uVar7 = pTVar10->m_cap;
  }
  NVar1 = pTVar9->m_buf[n].m_type.type;
  if ((n == 0xffffffffffffffff) || (pTVar9 = pTVar10, uVar7 <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      sVar6 = (*pcVar2)();
      return sVar6;
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar9 = this->t;
    uVar7 = pTVar9->m_cap;
  }
  NVar4 = pTVar10->m_buf[n].m_type.type;
  if ((n == 0xffffffffffffffff) || (pTVar10 = pTVar9, uVar7 <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      sVar6 = (*pcVar2)();
      return sVar6;
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar10 = this->t;
  }
  sVar6 = (ulong)((NVar1 & (SEQ|MAP|VAL)) != NOTYPE & (byte)(NVar1 >> 9)) +
          (ulong)((~(int)NVar3 & 0x102U) == 0) + (ulong)(((uint)(int)NVar4 >> 6 & 1) != 0) +
          (ulong)(((uint)(int)pTVar9->m_buf[n].m_type.type >> 7 & 1) != 0);
  for (n_00 = Tree::first_child(pTVar10,n); n_00 != 0xffffffffffffffff;
      n_00 = Tree::next_sibling(this->t,n_00)) {
    sVar8 = count_anchors_and_refs(this,n_00);
    sVar6 = sVar6 + sVar8;
  }
  return sVar6;
}

Assistant:

size_t count_anchors_and_refs(size_t n)
    {
        size_t c = 0;
        c += t->has_key_anchor(n);
        c += t->has_val_anchor(n);
        c += t->is_key_ref(n);
        c += t->is_val_ref(n);
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
            c += count_anchors_and_refs(ch);
        return c;
    }